

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O1

FT_Bool tt_check_trickyness(FT_Face face)

{
  code *pcVar1;
  FT_Stream stream;
  byte bVar2;
  int iVar3;
  FT_Error FVar4;
  FT_UInt32 FVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  char *__s;
  ulong uVar14;
  bool bVar15;
  int local_b8 [34];
  
  if (face == (FT_Face)0x0) {
    return '\0';
  }
  __s = face->family_name;
  if (__s != (char *)0x0) {
    sVar6 = strlen(__s);
    if ((7 < sVar6) && (__s[6] == '+')) {
      lVar7 = 0;
      do {
        if (0x19 < (int)__s[lVar7] - 0x41U) goto LAB_00260796;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      __s = __s + 7;
    }
LAB_00260796:
    lVar7 = 0;
    do {
      pcVar8 = strstr(__s,&tt_check_trickyness_family_trick_names + lVar7);
      if (pcVar8 != (char *)0x0) break;
      bVar15 = lVar7 != 0x17c;
      lVar7 = lVar7 + 0x14;
    } while (bVar15);
    if (pcVar8 != (char *)0x0) {
      return '\x01';
    }
  }
  local_b8[0x1c] = 0;
  local_b8[0x1d] = 0;
  local_b8[0x1e] = 0;
  local_b8[0x18] = 0;
  local_b8[0x19] = 0;
  local_b8[0x1a] = 0;
  local_b8[0x1b] = 0;
  local_b8[0x14] = 0;
  local_b8[0x15] = 0;
  local_b8[0x16] = 0;
  local_b8[0x17] = 0;
  local_b8[0x10] = 0;
  local_b8[0x11] = 0;
  local_b8[0x12] = 0;
  local_b8[0x13] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  if (*(short *)&face[1].family_name == 0) {
    bVar15 = true;
  }
  else {
    uVar14 = 0;
    bVar15 = false;
    do {
      lVar11 = uVar14 * 0x20;
      lVar7 = *(long *)(face[1].style_name + lVar11);
      if (lVar7 == 0x63767420) {
        bVar15 = true;
        iVar12 = 0;
LAB_0026086b:
        lVar7 = 0;
        uVar9 = 0;
        do {
          if (*(long *)(face[1].style_name + lVar11 + 0x18) ==
              *(long *)(tt_check_trickyness_sfnt_ids_sfnt_id +
                       (ulong)(uint)(iVar12 << 4) + 8 + lVar7 * 0x30)) {
            if (uVar9 == 0) {
              pcVar1 = (code *)face[3].generic.data;
              if (pcVar1 == (code *)0x0) {
                uVar9 = 0;
              }
              else {
                iVar3 = (*pcVar1)(face,*(undefined8 *)(face[1].style_name + lVar11),face->stream,0);
                uVar9 = 0;
                if (iVar3 == 0) {
                  stream = face->stream;
                  uVar9 = *(ulong *)(face[1].style_name + lVar11 + 0x18);
                  FVar4 = FT_Stream_EnterFrame(stream,uVar9);
                  if (FVar4 == 0) {
                    uVar13 = 0;
                    if (3 < uVar9) {
                      uVar13 = 0;
                      do {
                        FVar5 = FT_Stream_GetULong(stream);
                        uVar13 = uVar13 + FVar5;
                        uVar9 = uVar9 - 4;
                      } while (3 < uVar9);
                    }
                    if (uVar9 != 0) {
                      bVar10 = 0x18;
                      do {
                        bVar2 = FT_Stream_GetByte(stream);
                        uVar13 = uVar13 + ((uint)bVar2 << (bVar10 & 0x1f));
                        bVar10 = bVar10 - 8;
                        uVar9 = uVar9 - 1;
                      } while (uVar9 != 0);
                    }
                    FT_Stream_ExitFrame(stream);
                    uVar9 = (ulong)uVar13;
                  }
                  else {
                    uVar9 = 0;
                  }
                }
              }
            }
            if (*(ulong *)(tt_check_trickyness_sfnt_ids_sfnt_id +
                          (ulong)(uint)(iVar12 << 4) + lVar7 * 0x30) == uVar9) {
              local_b8[lVar7] = local_b8[lVar7] + 1;
            }
            if (local_b8[lVar7] == 3) {
              return '\x01';
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x1f);
      }
      else {
        if (lVar7 == 0x70726570) {
          iVar12 = 2;
          goto LAB_0026086b;
        }
        if (lVar7 == 0x6670676d) {
          iVar12 = 1;
          goto LAB_0026086b;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < *(ushort *)&face[1].family_name);
    bVar15 = !bVar15;
  }
  lVar7 = 0;
  while( true ) {
    if ((bool)(lVar7 - 0x10U < 0xc & bVar15)) {
      local_b8[lVar7] = local_b8[lVar7] + 1;
    }
    if (local_b8[lVar7] == 3) break;
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x1f) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

static FT_Bool
  tt_check_trickyness( FT_Face  face )
  {
    if ( !face )
      return FALSE;

    /* For first, check the face name for quick check. */
    if ( face->family_name                               &&
         tt_check_trickyness_family( face->family_name ) )
    {
      FT_TRACE3(( "found as a tricky font"
                  " by its family name: %s\n", face->family_name ));
      return TRUE;
    }

    /* Type42 fonts may lack `name' tables, we thus try to identify */
    /* tricky fonts by checking the checksums of Type42-persistent  */
    /* sfnt tables (`cvt', `fpgm', and `prep').                     */
    if ( tt_check_trickyness_sfnt_ids( (TT_Face)face ) )
    {
      FT_TRACE3(( "found as a tricky font"
                  " by its cvt/fpgm/prep table checksum\n" ));
      return TRUE;
    }

    return FALSE;
  }